

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_tests.cpp
# Opt level: O0

void __thiscall hash_tests::siphash::test_method(siphash *this)

{
  Span<const_unsigned_char> data;
  Span<const_unsigned_char> data_00;
  Span<const_unsigned_char> data_01;
  Span<const_unsigned_char> data_02;
  Span<const_unsigned_char> data_03;
  Span<const_unsigned_char> data_04;
  Span<const_unsigned_char> data_05;
  Span<const_unsigned_char> data_06;
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  uint32_t n;
  uint64_t k2;
  uint64_t k1;
  int i;
  uint8_t x_1;
  CMutableTransaction tx;
  uint8_t x;
  uint8_t nb [4];
  CSipHasher sip288;
  CSipHasher sip256;
  uint256 x_2;
  FastRandomContext ctx;
  HashWriter ss;
  CSipHasher hasher3;
  CSipHasher hasher2;
  CSipHasher hasher;
  char *in_stack_fffffffffffff3d8;
  CMutableTransaction *in_stack_fffffffffffff3e0;
  char *in_stack_fffffffffffff3e8;
  FastRandomContext *in_stack_fffffffffffff3f0;
  HashWriter *in_stack_fffffffffffff3f8;
  undefined4 in_stack_fffffffffffff400;
  uint32_t in_stack_fffffffffffff404;
  pointer in_stack_fffffffffffff408;
  pointer in_stack_fffffffffffff410;
  CSipHasher *in_stack_fffffffffffff418;
  pointer in_stack_fffffffffffff430;
  pointer in_stack_fffffffffffff438;
  int local_900;
  byte local_8f7;
  CMutableTransaction local_8d0;
  CMutableTransaction local_870 [2];
  CMutableTransaction local_7f0;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction> local_790;
  undefined4 local_750;
  uint64_t local_748;
  undefined1 local_740 [16];
  undefined1 local_730 [96];
  uint64_t local_6d0;
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [71];
  byte local_671;
  CMutableTransaction local_670;
  CMutableTransaction local_610;
  CMutableTransaction local_5b0;
  CMutableTransaction local_550 [2];
  CMutableTransaction local_4e0 [2];
  CMutableTransaction local_470 [2];
  CMutableTransaction local_400;
  CMutableTransaction local_3a0 [2];
  CMutableTransaction local_330 [2];
  CMutableTransaction local_2c0;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CSipHasher::CSipHasher
            ((CSipHasher *)in_stack_fffffffffffff3e8,(uint64_t)in_stack_fffffffffffff3e0,
             (uint64_t)in_stack_fffffffffffff3d8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_2c0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
    local_2c0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x726fdb47dd0e0e31;
    in_stack_fffffffffffff3e8 = "0x726fdb47dd0e0e31ull";
    in_stack_fffffffffffff3e0 = &local_2c0;
    in_stack_fffffffffffff3d8 = "hasher.Finalize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_2c0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_2c0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x54,1,2,
               &local_2c0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Span<const_unsigned_char>::Span<1>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff3d8,(uchar (*) [1])0x6a0851);
  data.m_size = (size_t)in_stack_fffffffffffff438;
  data.m_data = (uchar *)in_stack_fffffffffffff430;
  CSipHasher::Write(in_stack_fffffffffffff418,data);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_330[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
    local_330[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x74f839c593dc67fd;
    in_stack_fffffffffffff3e8 = "0x74f839c593dc67fdull";
    in_stack_fffffffffffff3e0 = local_330;
    in_stack_fffffffffffff3d8 = "hasher.Finalize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_330[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_330[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x57,1,2,
               &local_330[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Span<const_unsigned_char>::Span<7>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff3d8,(uchar (*) [7])0x6a09da);
  data_00.m_size = (size_t)in_stack_fffffffffffff438;
  data_00.m_data = (uchar *)in_stack_fffffffffffff430;
  CSipHasher::Write(in_stack_fffffffffffff418,data_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_3a0[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
    local_3a0[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x93f5f5799a932462;
    in_stack_fffffffffffff3e8 = "0x93f5f5799a932462ull";
    in_stack_fffffffffffff3e0 = local_3a0;
    in_stack_fffffffffffff3d8 = "hasher.Finalize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_3a0[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_3a0[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x5a,1,2,
               &local_3a0[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CSipHasher::Write((CSipHasher *)in_stack_fffffffffffff408,
                    CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_400.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
    local_400.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x3f2acc7f57c29bdb;
    in_stack_fffffffffffff3e8 = "0x3f2acc7f57c29bdbull";
    in_stack_fffffffffffff3e0 = &local_400;
    in_stack_fffffffffffff3d8 = "hasher.Finalize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_400.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_400.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x5c,1,2,
               &local_400.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Span<const_unsigned_char>::Span<2>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff3d8,(uchar (*) [2])0x6a0cd2);
  data_01.m_size = (size_t)in_stack_fffffffffffff438;
  data_01.m_data = (uchar *)in_stack_fffffffffffff430;
  CSipHasher::Write(in_stack_fffffffffffff418,data_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_470[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
    local_470[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x4bc1b3f0968dd39c;
    in_stack_fffffffffffff3e8 = "0x4bc1b3f0968dd39cull";
    in_stack_fffffffffffff3e0 = local_470;
    in_stack_fffffffffffff3d8 = "hasher.Finalize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_470[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_470[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x5f,1,2,
               &local_470[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Span<const_unsigned_char>::Span<9>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff3d8,(uchar (*) [9])0x6a0e5b);
  data_02.m_size = (size_t)in_stack_fffffffffffff438;
  data_02.m_data = (uchar *)in_stack_fffffffffffff430;
  CSipHasher::Write(in_stack_fffffffffffff418,data_02);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_4e0[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
    local_4e0[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x2f2e6163076bcfad;
    in_stack_fffffffffffff3e8 = "0x2f2e6163076bcfadull";
    in_stack_fffffffffffff3e0 = local_4e0;
    in_stack_fffffffffffff3d8 = "hasher.Finalize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_4e0[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_4e0[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x62,1,2,
               &local_4e0[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Span<const_unsigned_char>::Span<5>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff3d8,(uchar (*) [5])0x6a0fe4);
  data_03.m_size = (size_t)in_stack_fffffffffffff438;
  data_03.m_data = (uchar *)in_stack_fffffffffffff430;
  CSipHasher::Write(in_stack_fffffffffffff418,data_03);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_550[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
    local_550[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x7127512f72f27cce;
    in_stack_fffffffffffff3e8 = "0x7127512f72f27cceull";
    in_stack_fffffffffffff3e0 = local_550;
    in_stack_fffffffffffff3d8 = "hasher.Finalize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_550[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_550[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x65,1,2,
               &local_550[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CSipHasher::Write((CSipHasher *)in_stack_fffffffffffff408,
                    CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_5b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
    local_5b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xe3ea96b5304a7d0;
    in_stack_fffffffffffff3e8 = "0x0e3ea96b5304a7d0ull";
    in_stack_fffffffffffff3e0 = &local_5b0;
    in_stack_fffffffffffff3d8 = "hasher.Finalize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_5b0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_5b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x67,1,2,
               &local_5b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CSipHasher::Write((CSipHasher *)in_stack_fffffffffffff408,
                    CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_610.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
    local_610.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xe612a3cb9ecba951;
    in_stack_fffffffffffff3e8 = "0xe612a3cb9ecba951ull";
    in_stack_fffffffffffff3e0 = &local_610;
    in_stack_fffffffffffff3d8 = "hasher.Finalize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_610.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_610.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x69,1,2,
               &local_610.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    local_39 = 0x1f;
    local_3a = 0x1e;
    local_3b = 0x1d;
    local_3c = 0x1c;
    local_3d = 0x1b;
    local_3e = 0x1a;
    local_3f = 0x19;
    local_40 = 0x18;
    local_41 = 0x17;
    local_42 = 0x16;
    local_43 = 0x15;
    local_44 = 0x14;
    local_45 = 0x13;
    local_46 = 0x12;
    local_47 = 0x11;
    local_48 = 0x10;
    local_49 = 0xf;
    local_4a = 0xe;
    local_4b = 0xd;
    local_4c = 0xc;
    local_4d = 0xb;
    local_4e = 10;
    local_4f = 9;
    local_50 = 8;
    local_51 = 7;
    local_52 = 6;
    local_53 = 5;
    local_54 = 4;
    local_55 = 3;
    local_56 = 2;
    local_57 = 1;
    local_58 = 0;
    local_670.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)SipHashUint256((uint64_t)in_stack_fffffffffffff418,
                                        (uint64_t)in_stack_fffffffffffff410,
                                        (uint256 *)in_stack_fffffffffffff408);
    local_670.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x7127512f72f27cce;
    in_stack_fffffffffffff3e8 = "0x7127512f72f27cceull";
    in_stack_fffffffffffff3e0 = &local_670;
    in_stack_fffffffffffff3d8 =
         "SipHashUint256(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL, uint256{\"1f1e1d1c1b1a191817161514131211100f0e0d0c0b0a09080706050403020100\"})"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_670.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_670.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x6b,1,2,
               &local_670.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CSipHasher::CSipHasher
            ((CSipHasher *)in_stack_fffffffffffff3e8,(uint64_t)in_stack_fffffffffffff3e0,
             (uint64_t)in_stack_fffffffffffff3d8);
  for (local_671 = 0; uVar2 = (ulong)local_671,
      sVar3 = std::size<unsigned_long,64ul>((unsigned_long (*) [64])in_stack_fffffffffffff3d8),
      uVar2 < sVar3; local_671 = local_671 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                 (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff418,
                 (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
                 (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                 (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
      local_6d0 = CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
      in_stack_fffffffffffff3e0 =
           (CMutableTransaction *)(siphash_4_2_testvec + (ulong)local_671 * 8);
      in_stack_fffffffffffff3e8 = "siphash_4_2_testvec[x]";
      in_stack_fffffffffffff3d8 = "hasher2.Finalize()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_6b8,local_6c8,0x71,1,2,&local_6d0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff3d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    Span<unsigned_char>::Span<unsigned_char,_0>
              ((Span<unsigned_char> *)in_stack_fffffffffffff3e8,(uchar *)in_stack_fffffffffffff3e0,
               (size_t)in_stack_fffffffffffff3d8);
    Span<const_unsigned_char>::Span<unsigned_char,_0>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff3d8,
               (Span<unsigned_char> *)0x6a1882);
    data_04.m_size = (size_t)in_stack_fffffffffffff438;
    data_04.m_data = (uchar *)in_stack_fffffffffffff430;
    CSipHasher::Write(in_stack_fffffffffffff418,data_04);
  }
  CSipHasher::CSipHasher
            ((CSipHasher *)in_stack_fffffffffffff3e8,(uint64_t)in_stack_fffffffffffff3e0,
             (uint64_t)in_stack_fffffffffffff3d8);
  for (local_8f7 = 0;
      sVar3 = std::size<unsigned_long,64ul>((unsigned_long (*) [64])in_stack_fffffffffffff3d8),
      local_8f7 < sVar3; local_8f7 = local_8f7 + 8) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                 (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff418,
                 (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
                 (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                 (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
      local_748 = CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
      in_stack_fffffffffffff3e0 =
           (CMutableTransaction *)(siphash_4_2_testvec + (ulong)local_8f7 * 8);
      in_stack_fffffffffffff3e8 = "siphash_4_2_testvec[x]";
      in_stack_fffffffffffff3d8 = "hasher3.Finalize()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_730,local_740,0x78,1,2,&local_748);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff3d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    CSipHasher::Write((CSipHasher *)in_stack_fffffffffffff408,
                      CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
  }
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_c8 = 0;
  HashWriter::HashWriter((HashWriter *)in_stack_fffffffffffff3d8);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff3d8);
  local_750 = 1;
  local_790 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0
                        );
  HashWriter::operator<<
            ((HashWriter *)in_stack_fffffffffffff3e8,
             (ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)in_stack_fffffffffffff3e0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff418,
               (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
               (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
               (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
    HashWriter::GetHash(in_stack_fffffffffffff3f8);
    local_7f0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)SipHashUint256((uint64_t)in_stack_fffffffffffff418,
                                        (uint64_t)in_stack_fffffffffffff410,
                                        (uint256 *)in_stack_fffffffffffff408);
    local_7f0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x79751e980c2a0a35;
    in_stack_fffffffffffff3e8 = "0x79751e980c2a0a35ULL";
    in_stack_fffffffffffff3e0 = &local_7f0;
    in_stack_fffffffffffff3d8 = "SipHashUint256(1, 2, ss.GetHash())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (&local_7f0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish,
               &local_7f0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x83,1,2,
               &local_7f0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)in_stack_fffffffffffff3e8,
             SUB81((ulong)in_stack_fffffffffffff3e0 >> 0x38,0));
  for (local_900 = 0; local_900 < 0x10; local_900 = local_900 + 1) {
    FastRandomContext::rand64(in_stack_fffffffffffff3f0);
    FastRandomContext::rand64(in_stack_fffffffffffff3f0);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff408);
    RandomMixin<FastRandomContext>::rand32
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff3d8);
    ::WriteLE32((uchar *)in_stack_fffffffffffff3e0,
                (uint32_t)((ulong)in_stack_fffffffffffff3d8 >> 0x20));
    CSipHasher::CSipHasher
              ((CSipHasher *)in_stack_fffffffffffff3e8,(uint64_t)in_stack_fffffffffffff3e0,
               (uint64_t)in_stack_fffffffffffff3d8);
    Span<const_unsigned_char>::Span<uint256>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff3e8,
               (uint256 *)in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
    data_05.m_size = (size_t)in_stack_fffffffffffff438;
    data_05.m_data = (uchar *)in_stack_fffffffffffff430;
    CSipHasher::Write(in_stack_fffffffffffff418,data_05);
    local_238 = local_200;
    uStack_230 = uStack_1f8;
    local_248 = local_210;
    uStack_240 = uStack_208;
    local_258 = local_220;
    uStack_250 = uStack_218;
    Span<const_unsigned_char>::Span<4>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff3d8,(uchar (*) [4])0x6a2092);
    data_06.m_size = (size_t)in_stack_fffffffffffff438;
    data_06.m_data = (uchar *)in_stack_fffffffffffff430;
    CSipHasher::Write(in_stack_fffffffffffff418,data_06);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                 (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff418,
                 (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
                 (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                 (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
      in_stack_fffffffffffff438 =
           (pointer)SipHashUint256((uint64_t)in_stack_fffffffffffff418,
                                   (uint64_t)in_stack_fffffffffffff410,
                                   (uint256 *)in_stack_fffffffffffff408);
      local_870[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = in_stack_fffffffffffff438;
      in_stack_fffffffffffff430 =
           (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
      in_stack_fffffffffffff3e8 = "sip256.Finalize()";
      in_stack_fffffffffffff3e0 = local_870;
      in_stack_fffffffffffff3d8 = "SipHashUint256(k1, k2, x)";
      local_870[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = in_stack_fffffffffffff430;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (&local_870[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish,
                 &local_870[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0x92,1,2,
                 &local_870[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff3d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                 (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff418,
                 (const_string *)in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408,
                 (const_string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400));
      in_stack_fffffffffffff418 = (CSipHasher *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff3e0,(char (*) [1])in_stack_fffffffffffff3d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                 (pointer)in_stack_fffffffffffff3e0,(unsigned_long)in_stack_fffffffffffff3d8);
      in_stack_fffffffffffff410 =
           (pointer)SipHashUint256Extra((uint64_t)in_stack_fffffffffffff418,
                                        (uint64_t)in_stack_fffffffffffff410,
                                        (uint256 *)in_stack_fffffffffffff408,
                                        in_stack_fffffffffffff404);
      local_8d0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = in_stack_fffffffffffff410;
      in_stack_fffffffffffff408 =
           (pointer)CSipHasher::Finalize((CSipHasher *)in_stack_fffffffffffff408);
      in_stack_fffffffffffff3e8 = "sip288.Finalize()";
      in_stack_fffffffffffff3e0 = &local_8d0;
      in_stack_fffffffffffff3d8 = "SipHashUint256Extra(k1, k2, x, n)";
      local_8d0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = in_stack_fffffffffffff408;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (&local_8d0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish,
                 &local_8d0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0x93,1,2,
                 &local_8d0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff3d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffff404 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff404);
    } while (bVar1);
  }
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffff3d8);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff3d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(siphash)
{
    CSipHasher hasher(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x726fdb47dd0e0e31ull);
    static const unsigned char t0[1] = {0};
    hasher.Write(t0);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x74f839c593dc67fdull);
    static const unsigned char t1[7] = {1,2,3,4,5,6,7};
    hasher.Write(t1);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x93f5f5799a932462ull);
    hasher.Write(0x0F0E0D0C0B0A0908ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x3f2acc7f57c29bdbull);
    static const unsigned char t2[2] = {16,17};
    hasher.Write(t2);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x4bc1b3f0968dd39cull);
    static const unsigned char t3[9] = {18,19,20,21,22,23,24,25,26};
    hasher.Write(t3);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x2f2e6163076bcfadull);
    static const unsigned char t4[5] = {27,28,29,30,31};
    hasher.Write(t4);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x7127512f72f27cceull);
    hasher.Write(0x2726252423222120ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x0e3ea96b5304a7d0ull);
    hasher.Write(0x2F2E2D2C2B2A2928ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0xe612a3cb9ecba951ull);

    BOOST_CHECK_EQUAL(SipHashUint256(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL, uint256{"1f1e1d1c1b1a191817161514131211100f0e0d0c0b0a09080706050403020100"}), 0x7127512f72f27cceull);

    // Check test vectors from spec, one byte at a time
    CSipHasher hasher2(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL);
    for (uint8_t x=0; x<std::size(siphash_4_2_testvec); ++x)
    {
        BOOST_CHECK_EQUAL(hasher2.Finalize(), siphash_4_2_testvec[x]);
        hasher2.Write(Span{&x, 1});
    }
    // Check test vectors from spec, eight bytes at a time
    CSipHasher hasher3(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL);
    for (uint8_t x=0; x<std::size(siphash_4_2_testvec); x+=8)
    {
        BOOST_CHECK_EQUAL(hasher3.Finalize(), siphash_4_2_testvec[x]);
        hasher3.Write(uint64_t(x)|(uint64_t(x+1)<<8)|(uint64_t(x+2)<<16)|(uint64_t(x+3)<<24)|
                     (uint64_t(x+4)<<32)|(uint64_t(x+5)<<40)|(uint64_t(x+6)<<48)|(uint64_t(x+7)<<56));
    }

    HashWriter ss{};
    CMutableTransaction tx;
    // Note these tests were originally written with tx.version=1
    // and the test would be affected by default tx version bumps if not fixed.
    tx.version = 1;
    ss << TX_WITH_WITNESS(tx);
    BOOST_CHECK_EQUAL(SipHashUint256(1, 2, ss.GetHash()), 0x79751e980c2a0a35ULL);

    // Check consistency between CSipHasher and SipHashUint256[Extra].
    FastRandomContext ctx;
    for (int i = 0; i < 16; ++i) {
        uint64_t k1 = ctx.rand64();
        uint64_t k2 = ctx.rand64();
        uint256 x = m_rng.rand256();
        uint32_t n = ctx.rand32();
        uint8_t nb[4];
        WriteLE32(nb, n);
        CSipHasher sip256(k1, k2);
        sip256.Write(x);
        CSipHasher sip288 = sip256;
        sip288.Write(nb);
        BOOST_CHECK_EQUAL(SipHashUint256(k1, k2, x), sip256.Finalize());
        BOOST_CHECK_EQUAL(SipHashUint256Extra(k1, k2, x, n), sip288.Finalize());
    }
}